

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.cpp
# Opt level: O0

void __thiscall setup::type_entry::load(type_entry *this,istream *is,info *i)

{
  bool bVar1;
  _Alloc_hider _Var2;
  uint uVar3;
  enum_type eVar4;
  unsigned_long uVar5;
  int_adapter<unsigned_int> *in_RDX;
  istream *in_RSI;
  string *in_RDI;
  type_flags options;
  stored_enum<setup::(anonymous_namespace)::stored_setup_type> *in_stack_000000d8;
  stored_flags<setup::(anonymous_namespace)::stored_type_flags,_32UL> *in_stack_000000f8;
  enum_type in_stack_ffffffffffffff28;
  enum_type in_stack_ffffffffffffff2c;
  istream *in_stack_ffffffffffffff30;
  istream *in_stack_ffffffffffffff38;
  istream *this_00;
  encoded_string local_88;
  encoded_string local_70;
  encoded_string local_58;
  encoded_string local_40;
  Type local_28;
  Type local_20;
  int_adapter<unsigned_int> *local_18;
  istream *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_20.super__Base_bitset<1UL>._M_w = (_Base_bitset<1UL>)operator~(in_stack_ffffffffffffff2c);
  local_28.super__Base_bitset<1UL>._M_w =
       (_Base_bitset<1UL>)operator|(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28);
  this_00 = local_10;
  util::encoded_string::encoded_string(&local_40,in_RDI,local_18[6].value_);
  util::operator>>(in_stack_ffffffffffffff30,
                   (encoded_string *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  util::encoded_string::encoded_string(&local_58,in_RDI + 1,local_18[6].value_);
  util::operator>>(in_stack_ffffffffffffff30,
                   (encoded_string *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  uVar3 = boost::date_time::int_adapter<unsigned_int>::as_number(local_18);
  if (uVar3 < 0x4000100) {
    std::__cxx11::string::clear();
  }
  else {
    in_stack_ffffffffffffff38 = local_10;
    util::encoded_string::encoded_string(&local_70,in_RDI + 2,local_18[6].value_);
    util::operator>>(in_stack_ffffffffffffff30,
                     (encoded_string *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28)
                    );
  }
  uVar3 = boost::date_time::int_adapter<unsigned_int>::as_number(local_18);
  if ((0x3ffffff < uVar3) ||
     ((bVar1 = setup::version::is_isx((version *)in_stack_ffffffffffffff30), bVar1 &&
      (uVar3 = boost::date_time::int_adapter<unsigned_int>::as_number(local_18), 0x10317ff < uVar3))
     )) {
    util::encoded_string::encoded_string(&local_88,in_RDI + 3,local_18[6].value_);
    util::operator>>(local_10,(encoded_string *)
                              CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    in_stack_ffffffffffffff30 = local_10;
  }
  else {
    std::__cxx11::string::clear();
  }
  windows_version_range::load
            ((windows_version_range *)this_00,in_stack_ffffffffffffff38,
             (version *)in_stack_ffffffffffffff30);
  stored_flags<setup::(anonymous_namespace)::stored_type_flags,_32UL>::stored_flags
            ((stored_flags<setup::(anonymous_namespace)::stored_type_flags,_32UL> *)
             in_stack_ffffffffffffff30,
             (istream *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  stored_flags<setup::(anonymous_namespace)::stored_type_flags,_32UL>::get(in_stack_000000f8);
  flags<setup::(anonymous_namespace)::type_flags_Enum_,_1UL>::operator&
            ((flags<setup::(anonymous_namespace)::type_flags_Enum_,_1UL> *)in_stack_ffffffffffffff38
             ,(enum_type)((ulong)in_stack_ffffffffffffff30 >> 0x20));
  _Var2 = (_Alloc_hider)
          flags<setup::(anonymous_namespace)::type_flags_Enum_,_1UL>::operator!=
                    ((flags<setup::(anonymous_namespace)::type_flags_Enum_,_1UL> *)
                     in_stack_ffffffffffffff30,
                     (Zero)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  in_RDI[6]._M_dataplus = _Var2;
  uVar3 = boost::date_time::int_adapter<unsigned_int>::as_number(local_18);
  if (uVar3 < 0x4000300) {
    *(undefined4 *)&in_RDI[6].field_0x4 = 0;
  }
  else {
    stored_enum<setup::(anonymous_namespace)::stored_setup_type>::stored_enum
              ((stored_enum<setup::(anonymous_namespace)::stored_setup_type> *)
               in_stack_ffffffffffffff30,
               (istream *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    eVar4 = stored_enum<setup::(anonymous_namespace)::stored_setup_type>::get(in_stack_000000d8);
    *(enum_type *)&in_RDI[6].field_0x4 = eVar4;
  }
  uVar3 = boost::date_time::int_adapter<unsigned_int>::as_number(local_18);
  if (uVar3 < 0x4000000) {
    uVar3 = util::load<unsigned_int>((istream *)0x18a309);
    in_RDI[6]._M_string_length = (ulong)uVar3;
  }
  else {
    uVar5 = util::load<unsigned_long>((istream *)0x18a2eb);
    in_RDI[6]._M_string_length = uVar5;
  }
  return;
}

Assistant:

void type_entry::load(std::istream & is, const info & i) {
	
	USE_FLAG_NAMES(setup::type_flags)
	
	is >> util::encoded_string(name, i.codepage);
	is >> util::encoded_string(description, i.codepage);
	if(i.version >= INNO_VERSION(4, 0, 1)) {
		is >> util::encoded_string(languages, i.codepage);
	} else {
		languages.clear();
	}
	if(i.version >= INNO_VERSION(4, 0, 0) || (i.version.is_isx() && i.version >= INNO_VERSION(1, 3, 24))) {
		is >> util::encoded_string(check, i.codepage);
	} else {
		check.clear();
	}
	
	winver.load(is, i.version);
	
	type_flags options = stored_flags<stored_type_flags>(is).get();
	custom_type = ((options & CustomSetupType) != 0);
	
	if(i.version >= INNO_VERSION(4, 0, 3)) {
		type = stored_enum<stored_setup_type>(is).get();
	} else {
		type = User;
	}
	
	if(i.version >= INNO_VERSION(4, 0, 0)) {
		size = util::load<boost::uint64_t>(is);
	} else {
		size = util::load<boost::uint32_t>(is);
	}
}